

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_test_ranges.c
# Opt level: O1

int main(void)

{
  uint __fd;
  uint uVar1;
  void *__addr;
  ulong uVar2;
  stat sb;
  stat local_b0;
  
  __fd = open("mmaptest.file",2,0);
  fstat(__fd,&local_b0);
  printf("file desc: %d, size: %lu\n",(ulong)__fd,local_b0.st_size);
  puts("Original content:");
  __addr = mmap((void *)0x0,0xa000,2,1,__fd,0);
  if (__addr != (void *)0xffffffffffffffff) {
    uVar2 = 0;
    do {
      printf("[%lu]=%X ",uVar2 & 0xffffffff,(ulong)(uint)(int)*(char *)((long)__addr + uVar2));
      uVar2 = uVar2 + 1;
    } while (uVar2 != 10);
    putchar(10);
    uVar1 = munmap(__addr,0x1000);
    printf("Unmapped from the beginning, success? %d\n",(ulong)uVar1);
    uVar1 = munmap(__addr,0x2000);
    printf("Right overlap, success? %d\n",(ulong)uVar1);
    uVar1 = munmap((void *)((long)__addr + 0x9000),0x1000);
    printf("Left overlap, success? %d\n",(ulong)uVar1);
    uVar1 = munmap((void *)((long)__addr + 0x3000),0x5000);
    printf("Enclosed overlap, success? %d\n",(ulong)uVar1);
    uVar1 = munmap(__addr,0x4000);
    printf("Enclosing overlap, success? %d\n",(ulong)uVar1);
    close(__fd);
    return 0;
  }
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(){
    char *memblock;
    int fd;
    struct stat sb;
    int i;

    fd = open("mmaptest.file", O_RDWR, 0);

    fstat(fd, &sb);
    printf("file desc: %d, size: %lu\n", fd, (uint64_t)sb.st_size);

    printf("Original content:\n");
    memblock = mmap(NULL, 4096 * 10, O_RDWR, MAP_SHARED, fd, 0);
    if (memblock == MAP_FAILED) handle_error("mmap");

    for (i = 0; i < 10; i++) {
        printf("[%lu]=%X ", i, memblock[i]);
    }
    printf("\n");

    //unmap the beginning
    int ret = munmap(memblock, 4096);
    printf("Unmapped from the beginning, success? %d\n", ret);

    //right overlap
    ret = munmap(memblock, 4096 * 2);
    printf("Right overlap, success? %d\n", ret);

    //left overlap
    ret = munmap(memblock + 4096 * 9, 4096);
    printf("Left overlap, success? %d\n", ret);

    //enclosed
    ret = munmap(memblock + 4096 * 3, 4096 * 5);
    printf("Enclosed overlap, success? %d\n", ret);

    //enclosing
    ret = munmap(memblock, 4096 * 4);
    printf("Enclosing overlap, success? %d\n", ret);

    close(fd);
    return 0;
}